

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_887c0::CpuAbsoluteTest_rla_sets_c_and_n_Test::
~CpuAbsoluteTest_rla_sets_c_and_n_Test(CpuAbsoluteTest_rla_sets_c_and_n_Test *this)

{
  CpuAbsoluteTest_rla_sets_c_and_n_Test *this_local;
  
  ~CpuAbsoluteTest_rla_sets_c_and_n_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuAbsoluteTest, rla_sets_c_and_n) {
    registers.p = Z_FLAG;
    registers.a = 0b11110000;
    expected.a = 0b10000000;
    expected.p = C_FLAG | N_FLAG;
    memory_content = 0b11000001;

    run_readwrite_instruction(RLA_ABS, 0b10000010);
}